

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi-threads-1.cpp
# Opt level: O2

void __thiscall producer_t::produce(producer_t *this)

{
  redis_accessor_t *tx_buff;
  single_command_t cmd_ping;
  command_wrapper_t local_70;
  _Vector_base<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>
  local_50;
  executor_binder<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_basiliscos[P]cpp_bredis_examples_multi_threads_1_cpp:70:47),_boost::asio::io_context::strand>
  local_38;
  
  bredis::single_command_t::single_command_t<char_const(&)[5],void>
            ((single_command_t *)&local_50,(char (*) [5])"PING");
  tx_buff = this->redis;
  std::
  vector<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>
  ::vector((vector<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>
            *)&local_70.storage_,
           (vector<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>
            *)&local_50);
  local_70.which_ = 0;
  local_38.
  super_executor_binder_base<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_basiliscos[P]cpp_bredis_examples_multi_threads_1_cpp:70:47),_boost::asio::io_context::strand,_false>
  .executor_.service_ = (this->redis->strand).service_;
  local_38.
  super_executor_binder_base<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_basiliscos[P]cpp_bredis_examples_multi_threads_1_cpp:70:47),_boost::asio::io_context::strand,_false>
  .executor_.impl_ = (this->redis->strand).impl_;
  local_38.
  super_executor_binder_base<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_basiliscos[P]cpp_bredis_examples_multi_threads_1_cpp:70:47),_boost::asio::io_context::strand,_false>
  .target_.this = this;
  bredis::
  Connection<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
  ::
  async_write<boost::asio::basic_streambuf<std::allocator<char>>,boost::asio::executor_binder<producer_t::produce()::_lambda(boost::system::error_code_const&,unsigned_long)_1_,boost::asio::io_context::strand>>
            ((Connection<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
              *)&tx_buff->conn,&tx_buff->tx_buff,&local_70,&local_38);
  boost::
  variant<bredis::single_command_t,_std::vector<bredis::single_command_t,_std::allocator<bredis::single_command_t>_>_>
  ::destroy_content(&local_70);
  std::
  _Vector_base<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>
  ::~_Vector_base(&local_50);
  return;
}

Assistant:

void produce(){
        r::single_command_t cmd_ping{"PING"};
        redis.conn.async_write(
            redis.tx_buff,
            cmd_ping,
            asio::bind_executor(redis.strand, [this](const sys::error_code &ec, std::size_t bytes_transferred){
                if (!ec){
                    auto self = this;
                    self->redis.ping_count++;
                    self->redis.tx_buff.consume(bytes_transferred);
                    self->produce();
                }
            })
        );
    }